

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimatedplane.cc
# Opt level: O2

void __thiscall gmath::EstimatedPlane::computePlane(EstimatedPlane *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  
  if (2 < this->n) {
    dVar14 = (double)this->n;
    dVar1 = this->sxx;
    dVar2 = this->syy;
    dVar3 = this->sxy;
    dVar7 = this->sx;
    dVar8 = this->sy;
    dVar10 = dVar14 * -dVar3;
    dVar9 = dVar10 * dVar3 +
            -dVar1 * dVar8 * dVar8 +
            -dVar2 * dVar7 * dVar7 + dVar1 * dVar14 * dVar2 + (dVar7 + dVar7) * dVar8 * dVar3;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar11 = dVar3 * dVar7 + -dVar1 * dVar8;
      dVar10 = dVar10 + dVar8 * dVar7;
      dVar4 = this->sz;
      dVar5 = this->syz;
      dVar6 = this->sxz;
      auVar12._0_8_ =
           dVar4 * (dVar3 * dVar8 + -dVar2 * dVar7) +
           dVar6 * (-dVar8 * dVar8 + dVar2 * dVar14) + dVar5 * dVar10;
      auVar12._8_8_ = dVar4 * dVar11 + dVar6 * dVar10 + dVar5 * (dVar1 * dVar14 - dVar7 * dVar7);
      auVar13._8_8_ = dVar9;
      auVar13._0_8_ = dVar9;
      auVar13 = divpd(auVar12,auVar13);
      this->a = (double)auVar13._0_8_;
      this->b = (double)auVar13._8_8_;
      this->c = ((-dVar3 * dVar3 + dVar1 * dVar2) * dVar4 +
                (dVar8 * dVar3 - dVar2 * dVar7) * dVar6 + dVar11 * dVar5) / dVar9;
    }
  }
  return;
}

Assistant:

void EstimatedPlane::computePlane()
{
  if (n >= 3)
  {
    double div=n*sxx*syy+2*sx*sy*sxy-syy*sx*sx-sxx*sy*sy-n*sxy*sxy;

    if (fabs(div) != 0)
    {
      a=(sxz*(n*syy-sy*sy)+syz*(sx*sy-n*sxy)+sz*(sxy*sy-sx*syy))/div;
      b=(sxz*(sx*sy-n*sxy)+syz*(n*sxx-sx*sx)+sz*(sx*sxy-sxx*sy))/div;
      c=(sxz*(sxy*sy-sx*syy)+syz*(sx*sxy-sxx*sy)+sz*(sxx*syy-sxy*sxy))/div;
    }
  }
}